

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.c
# Opt level: O0

void * coll_deque_insert_at(coll_deque_t *deque,void *data,size_t index)

{
  size_t p;
  size_t pos;
  size_t index_local;
  void *data_local;
  coll_deque_t *deque_local;
  
  if (deque->len < index) {
    deque_local = (coll_deque_t *)0x0;
  }
  else if (index == deque->len) {
    deque_local = (coll_deque_t *)coll_deque_append(deque,data);
  }
  else {
    if (deque->len == deque->cap) {
      coll_deque_resize(deque);
    }
    p = index_to_pos(deque,index);
    if (index < deque->len >> 1) {
      coll_deque_reserve(deque,p,true);
      deque->data[p - 1] = data;
    }
    else {
      coll_deque_reserve(deque,p,false);
      deque->data[p] = data;
    }
    deque->len = deque->len + 1;
    deque_local = (coll_deque_t *)data;
  }
  return deque_local;
}

Assistant:

void *coll_deque_insert_at(coll_deque_t *deque, void *data, size_t index) {
    if (index > deque->len) {
        return NULL;
    } else if (index == deque->len) {
        return coll_deque_append(deque, data);
    }
    if (deque->len == deque->cap) {
        coll_deque_resize(deque);
    }

    size_t pos = index_to_pos(deque, index);

    if (index < deque->len / 2) {
        coll_deque_reserve(deque, pos, true);
        deque->data[--pos] = data;
    } else {
        coll_deque_reserve(deque, pos, false);
        deque->data[pos] = data;
    }
    ++(deque->len);
    return data;
}